

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

string * Catch::StringMaker<signed_char,void>::convert_abi_cxx11_(char value)

{
  char in_SIL;
  string *in_RDI;
  char chstr [4];
  uint *in_stack_ffffffffffffff98;
  allocator *paVar1;
  allocator local_29;
  char local_28;
  char cStack_27;
  undefined2 uStack_26;
  int local_24;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [19];
  allocator local_a [10];
  
  if (in_SIL == '\r') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"\'\\r\'",local_a);
    std::allocator<char>::~allocator((allocator<char> *)local_a);
  }
  else if (in_SIL == '\f') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"\'\\f\'",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
  }
  else if (in_SIL == '\n') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"\'\\n\'",&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  }
  else if (in_SIL == '\t') {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,"\'\\t\'",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
  }
  else if ((in_SIL < '\0') || ('\x1f' < in_SIL)) {
    _local_28 = CONCAT22(0x27,CONCAT11(in_SIL,0x27));
    paVar1 = &local_29;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,&local_28,paVar1);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  else {
    local_24 = (int)in_SIL;
    Detail::stringify<unsigned_int>(in_stack_ffffffffffffff98);
  }
  return in_RDI;
}

Assistant:

std::string StringMaker<signed char>::convert(signed char value) {
    if (value == '\r') {
        return "'\\r'";
    } else if (value == '\f') {
        return "'\\f'";
    } else if (value == '\n') {
        return "'\\n'";
    } else if (value == '\t') {
        return "'\\t'";
    } else if ('\0' <= value && value < ' ') {
        return ::Catch::Detail::stringify(static_cast<unsigned int>(value));
    } else {
        char chstr[] = "' '";
        chstr[1] = value;
        return chstr;
    }
}